

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int file_read(FILE *stream,void *buffer,size_t size)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  
  sVar3 = fread_unlocked(buffer,size,1,(FILE *)stream);
  iVar2 = 1;
  if ((size != 0) && (sVar3 != 1)) {
    iVar2 = feof_unlocked((FILE *)stream);
    __stream = _stderr;
    pcVar1 = argv0;
    if (iVar2 == 0) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      iVar2 = 0;
      fprintf(__stream,"%s: failed reading %lu bytes: %s\n",pcVar1,size,pcVar5);
    }
    else {
      iVar2 = 0;
      fprintf(_stderr,"%s: failed reading %lu bytes: unexpected end of file\n",argv0,size);
    }
  }
  return iVar2;
}

Assistant:

int
file_read(
    FILE* stream,
    void* buffer,
    size_t size)
{
    if (fread_unlocked(buffer, size, 1, stream) != 1 && size != 0) {
        if (feof_unlocked(stream)) {
            fprintf(stderr,
                "%s: failed reading %lu bytes: unexpected end of file\n",
                argv0, (long unsigned int)size);
        } else {
            fprintf(stderr, "%s: failed reading %lu bytes: %s\n",
                argv0, (long unsigned int)size, strerror(errno));
        }
        return 0;
    } else
        return 1;
}